

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

void __thiscall TypeCode::saveXml(TypeCode *this,ostream *s)

{
  std::__ostream_insert<char,std::char_traits<char>>(s,"<type",5);
  Datatype::saveXmlBasic(&this->super_Datatype,s);
  std::__ostream_insert<char,std::char_traits<char>>(s,">\n",2);
  if (this->proto != (FuncProto *)0x0) {
    FuncProto::saveXml(this->proto,s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"</type>",7);
  return;
}

Assistant:

void TypeCode::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  s << ">\n";
  if (proto != (FuncProto *)0)
    proto->saveXml(s);
  s << "</type>";
}